

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3StreamReader.h
# Opt level: O1

void __thiscall AC3StreamReader::AC3StreamReader(AC3StreamReader *this)

{
  SimplePacketizerReader::SimplePacketizerReader(&this->super_SimplePacketizerReader);
  (this->super_AC3Codec).m_frame_size = 0;
  (this->super_AC3Codec).mlp.m_channels = '\0';
  (this->super_AC3Codec).mlp.m_samples = 0;
  (this->super_AC3Codec).mlp.m_samplerate = 0;
  *(undefined8 *)((long)&(this->super_AC3Codec).mlp.m_samplerate + 1) = 0;
  (this->super_AC3Codec).m_frameDuration = 0;
  (this->super_AC3Codec).m_mixinfoexists = false;
  (this->super_AC3Codec).m_isAtmos = false;
  (this->super_AC3Codec).m_state = stateDecodeAC3;
  (this->super_AC3Codec).m_waitMoreData = false;
  (this->super_AC3Codec).m_downconvertToAC3 = false;
  (this->super_AC3Codec).m_true_hd_mode = false;
  (this->super_AC3Codec).m_fscod = '\0';
  (this->super_AC3Codec).m_frmsizecod = 0;
  (this->super_AC3Codec).m_bsid = '\0';
  (this->super_AC3Codec).m_bsidBase = '\0';
  (this->super_AC3Codec).m_strmtyp = '\0';
  (this->super_AC3Codec).m_bsmod = '\0';
  *(undefined8 *)&(this->super_AC3Codec).m_bsidBase = 0;
  *(undefined8 *)((long)&(this->super_AC3Codec).m_sample_rate + 1) = 0;
  *(undefined8 *)&(this->super_AC3Codec).mlp.m_subType = 0;
  *(undefined8 *)((long)&(this->super_AC3Codec).m_samples + 2) = 0;
  (this->super_SimplePacketizerReader).super_AbstractStreamReader.super_BaseAbstractStreamReader.
  _vptr_BaseAbstractStreamReader = (_func_int **)&PTR__AC3StreamReader_0023fbb8;
  (this->super_AC3Codec)._vptr_AC3Codec = (_func_int **)&PTR__AC3StreamReader_0023fcd0;
  this->m_useNewStyleAudioPES = false;
  (this->m_delayedAc3Packet).duration = 0;
  (this->m_delayedAc3Packet).pos = 0;
  (this->m_delayedAc3Packet).pcr = 0;
  (this->m_delayedAc3Packet).codec = (BaseAbstractStreamReader *)0x0;
  (this->m_delayedAc3Packet).codecID = 0;
  *(undefined4 *)((long)&(this->super_AC3Codec).m_state + 3) = 0;
  (this->super_AC3Codec).m_state = stateDecodeAC3;
  (this->m_delayedAc3Packet).flags = 0;
  (this->m_delayedAc3Packet).data = (uint8_t *)0x0;
  (this->m_delayedAc3Packet).size = 0;
  (this->m_delayedAc3Packet).stream_index = 0;
  (this->m_delayedAc3Packet).pts = 0;
  (this->m_delayedAc3Packet).dts = 0;
  (this->m_delayedAc3Buffer).m_data.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_delayedAc3Buffer).m_size = 0;
  (this->m_delayedAc3Buffer).m_data.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_delayedAc3Buffer).m_data.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->m_thdDemuxWaitAc3 = true;
  this->m_demuxedTHDSamples = 0;
  this->m_totalTHDSamples = 0;
  this->m_nextAc3Time = 0;
  return;
}

Assistant:

AC3StreamReader() : m_useNewStyleAudioPES(false)
    {
        m_downconvertToAC3 = m_true_hd_mode = false;
        m_state = AC3State::stateDecodeAC3;
        m_waitMoreData = false;

        m_thdDemuxWaitAc3 = true;  // wait ac3 packet
        m_demuxedTHDSamples = 0;
        m_totalTHDSamples = 0;
        m_nextAc3Time = 0;
    }